

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O1

void solver2_logging_order_rec(sat_solver2 *s,int x)

{
  int *piVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  
  if (((uint)s->vi[x] & 0x20) == 0) {
    uVar2 = (s->Mem).uPageMask & s->reasons[x];
    if (uVar2 == 0) {
      __assert_fail("k",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satClause.h"
                    ,0x61,"clause *Sat_MemClause(Sat_Mem_t *, int, int)");
    }
    piVar1 = (s->Mem).pPages[s->reasons[x] >> ((byte)(s->Mem).nPageSize & 0x1f)];
    if (0xfff < (uint)piVar1[(int)uVar2]) {
      uVar3 = 1;
      do {
        if ((uint)piVar1[(long)(int)uVar2 + uVar3 + 1] < 2) break;
        iVar4 = piVar1[(long)(int)uVar2 + uVar3 + 1] >> 1;
        if ((s->levels[iVar4] != 0) && (((uint)s->vi[iVar4] & 4) == 0)) {
          solver2_logging_order_rec(s,iVar4);
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < (uint)piVar1[(int)uVar2] >> 0xb);
    }
    if (((uint)s->vi[x] & 0x3c) == 0) {
      uVar2 = (s->tagged).cap;
      if ((s->tagged).size == uVar2) {
        iVar4 = (uVar2 >> 1) * 3;
        if ((int)uVar2 < 4) {
          iVar4 = uVar2 * 2;
        }
        piVar1 = (s->tagged).ptr;
        if (piVar1 == (int *)0x0) {
          piVar1 = (int *)malloc((long)iVar4 << 2);
        }
        else {
          piVar1 = (int *)realloc(piVar1,(long)iVar4 << 2);
        }
        (s->tagged).ptr = piVar1;
        if (piVar1 == (int *)0x0) {
          printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                 (double)(s->tagged).cap * 9.5367431640625e-07,(double)iVar4 * 9.5367431640625e-07);
          fflush(_stdout);
        }
        (s->tagged).cap = iVar4;
      }
      iVar4 = (s->tagged).size;
      (s->tagged).size = iVar4 + 1;
      (s->tagged).ptr[iVar4] = x;
    }
    *(byte *)(s->vi + x) = *(byte *)(s->vi + x) | 0x20;
    uVar2 = (s->min_step_order).cap;
    if ((s->min_step_order).size == uVar2) {
      iVar4 = (uVar2 >> 1) * 3;
      if ((int)uVar2 < 4) {
        iVar4 = uVar2 * 2;
      }
      piVar1 = (s->min_step_order).ptr;
      if (piVar1 == (int *)0x0) {
        piVar1 = (int *)malloc((long)iVar4 << 2);
      }
      else {
        piVar1 = (int *)realloc(piVar1,(long)iVar4 << 2);
      }
      (s->min_step_order).ptr = piVar1;
      if (piVar1 == (int *)0x0) {
        printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
               (double)(s->min_step_order).cap * 9.5367431640625e-07,
               (double)iVar4 * 9.5367431640625e-07);
        fflush(_stdout);
      }
      (s->min_step_order).cap = iVar4;
    }
    iVar4 = (s->min_step_order).size;
    (s->min_step_order).size = iVar4 + 1;
    (s->min_step_order).ptr[iVar4] = x;
  }
  return;
}

Assistant:

static void solver2_logging_order_rec(sat_solver2* s, int x)
{
    clause* c;
    int i, y;
    if ( (var_tag(s,x) & 8) )
        return;
    c = clause2_read(s, var_reason(s,x));
    clause_foreach_var( c, y, i, 1 )
        if ( var_level(s,y) && (var_tag(s,y) & 1) == 0 )
            solver2_logging_order_rec(s, y);
    var_add_tag(s, x, 8);
    veci_push(&s->min_step_order, x);
}